

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O3

int Res_SatAddAnd(sat_solver *pSat,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1)

{
  int iVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  lit Lits [3];
  int local_44;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,iVar1);
  iVar3 = iVar * 2 + 1;
  local_40 = (uint)(fCompl0 != 0) + iVar0 * 2;
  local_44 = iVar3;
  iVar2 = sat_solver_addclause(pSat,&local_44,(lit *)&local_3c);
  uVar4 = 0;
  if (iVar2 != 0) {
    iVar2 = (int)local_38;
    local_40 = (uint)(fCompl1 != 0) + iVar2 * 2;
    local_44 = iVar3;
    iVar3 = sat_solver_addclause(pSat,&local_44,(lit *)&local_3c);
    if (iVar3 != 0) {
      local_44 = iVar * 2;
      local_40 = (uint)(fCompl0 == 0) | iVar0 * 2;
      local_3c = (uint)(fCompl1 == 0) | iVar2 * 2;
      iVar3 = sat_solver_addclause(pSat,&local_44,(lit *)&local_38);
      uVar4 = (uint)(iVar3 != 0);
    }
  }
  return uVar4;
}

Assistant:

int Res_SatAddAnd( sat_solver * pSat, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1 )
{
    lit Lits[3];

    Lits[0] = toLitCond( iVar, 1 );
    Lits[1] = toLitCond( iVar0, fCompl0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar, 1 );
    Lits[1] = toLitCond( iVar1, fCompl1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar, 0 );
    Lits[1] = toLitCond( iVar0, !fCompl0 );
    Lits[2] = toLitCond( iVar1, !fCompl1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}